

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmod.c
# Opt level: O0

void ps_hinter_done(PS_Hinter_Module module)

{
  PS_Hinter_Module module_local;
  
  (module->t1_funcs).hints = (T1_Hints)0x0;
  (module->t2_funcs).hints = (T2_Hints)0x0;
  ps_hints_done(&module->ps_hints);
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  ps_hinter_done( PS_Hinter_Module  module )
  {
    module->t1_funcs.hints = NULL;
    module->t2_funcs.hints = NULL;

    ps_hints_done( &module->ps_hints );
  }